

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_two_insertion_Test::TestBody
          (ByteBufferTest_test_two_insertion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a0;
  Message local_98;
  uchar local_8a [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  uchar local_62 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_40 [8];
  ByteBuffer byte_buffer;
  ByteBufferTest_test_two_insertion_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,0xc);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  local_62[1] = 0x61;
  local_62[0] = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::EqHelper<false>::Compare<char,unsigned_char>
            ((EqHelper<false> *)local_60,"\'a\'","byte_buffer.GetNextByte()",(char *)(local_62 + 1),
             local_62);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_8a[1] = 0x62;
  local_8a[0] = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::EqHelper<false>::Compare<char,unsigned_char>
            ((EqHelper<false> *)local_88,"\'b\'","byte_buffer.GetNextByte()",(char *)(local_8a + 1),
             local_8a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(ByteBufferTest, test_two_insertion)
{
    ByteBuffer byte_buffer(12);
    byte_buffer.WriteByte('a');
    byte_buffer.WriteByte('b');
    EXPECT_EQ('a', byte_buffer.GetNextByte());
    EXPECT_EQ('b', byte_buffer.GetNextByte());
}